

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O2

XrResult LoaderInstance::CreateInstance
                   (PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                   PFN_xrCreateInstance create_instance_term,
                   PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces,XrInstanceCreateInfo *info,
                   unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance
                   )

{
  char **__src;
  uint uVar1;
  char *pcVar2;
  pointer puVar3;
  ApiLayerInterface *pAVar4;
  PFN_xrCreateApiLayerInstance p_Var5;
  LoaderInstance *pLVar6;
  undefined1 auVar7 [16];
  pointer ppcVar8;
  bool bVar9;
  int iVar10;
  XrResult XVar11;
  RuntimeInterface *pRVar12;
  XrInstanceCreateInfo *pXVar13;
  LoaderInstance *this;
  pointer puVar14;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var15
  ;
  ulong uVar16;
  long lVar17;
  char **ppcVar18;
  unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> *layer_interface;
  long lVar19;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> __it;
  ulong uVar20;
  XrInstance_T *in_stack_fffffffffffffb88;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_skip;
  allocator local_441;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *__range3;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_438;
  char **local_418;
  XrInstance local_410;
  XrInstanceCreateInfo *local_408;
  XrInstanceCreateInfo *local_400;
  PFN_xrCreateApiLayerInstance local_3f8;
  XrInstanceCreateInfo *local_3f0;
  PFN_xrCreateInstance local_3e8;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *local_3e0;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  local_3d8;
  InstanceCreateInfoManager create_info_manager;
  string msg;
  
  __range3 = api_layer_interfaces;
  local_3e8 = create_instance_term;
  std::__cxx11::string::string((string *)&msg,"xrCreateInstance",(allocator *)&local_438);
  std::__cxx11::string::string
            ((string *)&create_info_manager,"Entering LoaderInstance::CreateInstance",
             (allocator *)&local_410);
  extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoaderLogger::LogVerboseMessage
            (&msg,(string *)&create_info_manager,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&extensions_to_skip)
  ;
  local_3f8 = create_api_layer_instance_term;
  local_3f0 = (XrInstanceCreateInfo *)get_instance_proc_addr_term;
  local_3e0 = loader_instance;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&extensions_to_skip)
  ;
  std::__cxx11::string::~string((string *)&create_info_manager);
  std::__cxx11::string::~string((string *)&msg);
  for (uVar16 = 0; uVar1 = info->enabledExtensionCount, uVar16 < uVar1; uVar16 = uVar16 + 1) {
    pRVar12 = RuntimeInterface::GetRuntime();
    std::__cxx11::string::string
              ((string *)&msg,info->enabledExtensionNames[uVar16],(allocator *)&create_info_manager)
    ;
    bVar9 = RuntimeInterface::SupportsExtension(pRVar12,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (!bVar9) {
      pcVar2 = info->enabledExtensionNames[uVar16];
      lVar19 = 0x10;
LAB_0010e246:
      if (lVar19 != 0xa8) goto code_r0x0010e24f;
      puVar14 = (__range3->
                super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (__range3->
               super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar14 == puVar3) {
          std::__cxx11::string::string
                    ((string *)&msg,
                     "LoaderInstance::CreateInstance, no support found for requested extension: ",
                     (allocator *)&create_info_manager);
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::string
                    ((string *)&create_info_manager,"xrCreateInstance",(allocator *)&local_438);
          extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LoaderLogger::LogErrorMessage
                    ((string *)&create_info_manager,&msg,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &extensions_to_skip);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &extensions_to_skip);
          std::__cxx11::string::~string((string *)&create_info_manager);
          std::__cxx11::string::~string((string *)&msg);
          return XR_ERROR_EXTENSION_NOT_PRESENT;
        }
        pAVar4 = (puVar14->_M_t).
                 super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                 .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
        std::__cxx11::string::string
                  ((string *)&msg,info->enabledExtensionNames[uVar16],
                   (allocator *)&create_info_manager);
        bVar9 = ApiLayerInterface::SupportsExtension(pAVar4,&msg);
        std::__cxx11::string::~string((string *)&msg);
        puVar14 = puVar14 + 1;
      } while (!bVar9);
    }
LAB_0010e2bd:
  }
  local_410 = (XrInstance)0x0;
  create_info_manager.original_create_info = info;
  memcpy(&create_info_manager.modified_create_info,info,0x148);
  create_info_manager.enabled_extensions_cstr.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  create_info_manager.enabled_extensions_cstr.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  create_info_manager.enabled_extensions_cstr.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&create_info_manager.enabled_extensions_cstr,(ulong)uVar1);
  lVar19 = 0;
  for (uVar16 = 0; uVar16 < (create_info_manager.original_create_info)->enabledExtensionCount;
      uVar16 = uVar16 + 1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&create_info_manager.enabled_extensions_cstr,
               (value_type *)
               ((long)(create_info_manager.original_create_info)->enabledExtensionNames + lVar19));
    lVar19 = lVar19 + 8;
  }
  create_info_manager.modified_create_info.enabledExtensionNames = (char **)0x0;
  if ((long)create_info_manager.enabled_extensions_cstr.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)create_info_manager.enabled_extensions_cstr.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    create_info_manager.modified_create_info.enabledExtensionNames =
         create_info_manager.enabled_extensions_cstr.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  create_info_manager.modified_create_info.enabledExtensionCount =
       (uint32_t)
       ((ulong)((long)create_info_manager.enabled_extensions_cstr.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)create_info_manager.enabled_extensions_cstr.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  pXVar13 = info;
  if (info->enabledExtensionCount != 0) {
    extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar19 = 0x10; lVar19 != 0xa8; lVar19 = lVar19 + 0x98) {
      pRVar12 = RuntimeInterface::GetRuntime();
      pcVar2 = LoaderSpecificExtensions::extensions._M_elems[0].extensionName + lVar19 + -0x10;
      std::__cxx11::string::string((string *)&msg,pcVar2,(allocator *)&local_438);
      bVar9 = RuntimeInterface::SupportsExtension(pRVar12,&msg);
      std::__cxx11::string::~string((string *)&msg);
      if (!bVar9) {
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const(&)[128]>
                  ((vector<char_const*,std::allocator<char_const*>> *)&extensions_to_skip,
                   (char (*) [128])pcVar2);
      }
    }
    local_418 = create_info_manager.enabled_extensions_cstr.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if ((create_info_manager.enabled_extensions_cstr.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         create_info_manager.enabled_extensions_cstr.
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_408 = (XrInstanceCreateInfo *)
                    extensions_to_skip.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,
       extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      pXVar13 = (XrInstanceCreateInfo *)
                extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar18 = create_info_manager.enabled_extensions_cstr.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      __it._M_current =
           create_info_manager.enabled_extensions_cstr.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      while (pXVar13 != local_408) {
        local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)pXVar13;
        local_400 = pXVar13;
        if (__it._M_current != ppcVar18) {
          lVar19 = (long)ppcVar18 - (long)__it._M_current;
          msg._M_dataplus._M_p = (pointer)&local_438;
          for (lVar17 = lVar19 >> 5; _Var15._M_current = __it._M_current, 0 < lVar17;
              lVar17 = lVar17 + -1) {
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                  *)&msg,__it);
            if (bVar9) goto LAB_0010e5de;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                  *)&msg,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                          )(__it._M_current + 1));
            _Var15._M_current = __it._M_current + 1;
            if (bVar9) goto LAB_0010e5de;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                  *)&msg,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                          )(__it._M_current + 2));
            _Var15._M_current = __it._M_current + 2;
            if (bVar9) goto LAB_0010e5de;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                  *)&msg,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                          )(__it._M_current + 3));
            _Var15._M_current = __it._M_current + 3;
            if (bVar9) goto LAB_0010e5de;
            __it._M_current = __it._M_current + 4;
            lVar19 = lVar19 + -0x20;
          }
          lVar19 = lVar19 >> 3;
          if (lVar19 == 1) {
LAB_0010e678:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                  *)&msg,__it);
            _Var15._M_current = __it._M_current;
            if (!bVar9) {
              _Var15._M_current = ppcVar18;
            }
LAB_0010e5de:
            if (_Var15._M_current != ppcVar18) {
              __src = _Var15._M_current + 1;
              if (__src != ppcVar18) {
                memmove(_Var15._M_current,__src,(long)ppcVar18 - (long)__src);
                local_418 = create_info_manager.enabled_extensions_cstr.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start;
                ppcVar18 = create_info_manager.enabled_extensions_cstr.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_finish;
              }
              ppcVar18 = ppcVar18 + -1;
              create_info_manager.enabled_extensions_cstr.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish = ppcVar18;
            }
          }
          else {
            if (lVar19 == 2) {
LAB_0010e659:
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                      ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                    *)&msg,__it);
              _Var15._M_current = __it._M_current;
              if (!bVar9) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0010e678;
              }
              goto LAB_0010e5de;
            }
            if (lVar19 == 3) {
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::{lambda(char_const*)#1}>
                      ::operator()((_Iter_pred<(anonymous_namespace)::InstanceCreateInfoManager::FilterOutExtension(char_const*)::_lambda(char_const*)_1_>
                                    *)&msg,__it);
              if (!bVar9) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0010e659;
              }
              goto LAB_0010e5de;
            }
          }
          create_info_manager.modified_create_info.enabledExtensionNames = local_418;
          if ((long)ppcVar18 - (long)local_418 == 0) {
            create_info_manager.modified_create_info.enabledExtensionNames = (char **)0x0;
          }
          create_info_manager.modified_create_info.enabledExtensionCount =
               (uint32_t)((ulong)((long)ppcVar18 - (long)local_418) >> 3);
          __it._M_current = local_418;
        }
        pXVar13 = (XrInstanceCreateInfo *)&local_400->next;
      }
      create_info_manager.modified_create_info.enabledExtensionNames = (char **)0x0;
      if ((long)ppcVar18 - (long)local_418 != 0) {
        create_info_manager.modified_create_info.enabledExtensionNames = local_418;
      }
      create_info_manager.modified_create_info.enabledExtensionCount =
           (uint32_t)((ulong)((long)ppcVar18 - (long)local_418) >> 3);
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    pXVar13 = &create_info_manager.modified_create_info;
  }
  puVar14 = (__range3->
            super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (__range3->
           super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 == puVar3) {
    XVar11 = (*local_3e8)(pXVar13,&local_410);
  }
  else {
    uVar20 = (long)puVar3 - (long)puVar14 >> 3;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar20;
    uVar16 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x128),8) == 0) {
      uVar16 = SUB168(auVar7 * ZEXT816(0x128),0);
    }
    extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new__(uVar16);
    lVar19 = 0;
    uVar16 = uVar20;
    while (bVar9 = uVar16 != 0, uVar16 = uVar16 - 1, bVar9) {
      *(undefined4 *)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19) = 5;
      *(undefined4 *)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19 + 4) = 1;
      *(undefined8 *)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19 + 8) = 0x128;
      lVar19 = lVar19 + 0x128;
    }
    lVar17 = 0;
    lVar19 = uVar20 * 0x128;
    local_408 = pXVar13;
    for (puVar14 = (__range3->
                   super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        ppcVar8 = extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        puVar14 !=
        (__range3->
        super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start; puVar14 = puVar14 + -1) {
      pAVar4 = puVar14[-1]._M_t.
               super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>.
               _M_t.
               super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>.
               super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
      local_400 = (XrInstanceCreateInfo *)pAVar4->_get_instance_proc_addr;
      p_Var5 = pAVar4->_create_api_layer_instance;
      std::__cxx11::string::string((string *)&msg,(string *)&pAVar4->_layer_name);
      strncpy((char *)((long)ppcVar8 + lVar19 + -0x118),msg._M_dataplus._M_p,0xff);
      std::__cxx11::string::~string((string *)&msg);
      *(undefined1 *)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19 + -0x19) = 0;
      *(long *)((long)extensions_to_skip.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar19 + -8) = lVar17;
      *(XrInstanceCreateInfo **)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19 + -0x18) = local_3f0;
      *(PFN_xrCreateApiLayerInstance *)
       ((long)extensions_to_skip.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar19 + -0x10) = local_3f8;
      lVar17 = lVar19 + -0x128 +
               (long)extensions_to_skip.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_3f0 = local_400;
      lVar19 = lVar19 + -0x128;
      local_3f8 = p_Var5;
    }
    memset((void *)((long)&msg.field_2 + 8),0,0x200);
    msg._M_dataplus._M_p = (pointer)0x100000004;
    msg._M_string_length = 0x220;
    msg.field_2._M_allocated_capacity = 0;
    XVar11 = (*local_3f8)(local_408,(XrApiLayerCreateInfo *)&msg,&local_410);
    std::unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_>::~unique_ptr
              ((unique_ptr<XrApiLayerNextInfo[],_std::default_delete<XrApiLayerNextInfo[]>_> *)
               &extensions_to_skip);
  }
  if (XVar11 < XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&msg,"xrCreateInstance",(allocator *)&stack0xfffffffffffffb8f);
    std::__cxx11::string::string
              ((string *)&extensions_to_skip,
               "LoaderInstance::CreateInstance chained CreateInstance call failed",&local_441);
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&msg,(string *)&extensions_to_skip,&local_438);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_438);
    std::__cxx11::string::~string((string *)&extensions_to_skip);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&create_info_manager.enabled_extensions_cstr.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  if (XR_ERROR_VALIDATION_FAILURE < XVar11) {
    this = (LoaderInstance *)operator_new(0x58);
    local_3d8.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (__range3->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_3d8.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (__range3->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_3d8.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (__range3->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__range3->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__range3->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__range3->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderInstance(this,local_410,info,(PFN_xrGetInstanceProcAddr)local_3f0,&local_3d8);
    pLVar6 = (local_3e0->_M_t).
             super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
             super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
             super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
    (local_3e0->_M_t).super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
    _M_t.super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
    super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl = this;
    if (pLVar6 != (LoaderInstance *)0x0) {
      (*pLVar6->_vptr_LoaderInstance[1])();
    }
    std::
    vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ::~vector(&local_3d8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    std::operator<<((ostream *)&msg,"LoaderInstance::CreateInstance succeeded with ");
    std::ostream::_M_insert<unsigned_long>((ulong)&msg);
    std::operator<<((ostream *)&msg," layers enabled and runtime interface - created instance = ");
    HandleToHexString<XrInstance_T*>(in_stack_fffffffffffffb88);
    std::operator<<((ostream *)&msg,(string *)&create_info_manager);
    std::__cxx11::string::~string((string *)&create_info_manager);
    std::__cxx11::string::string
              ((string *)&create_info_manager,"xrCreateInstance",
               (allocator *)&stack0xfffffffffffffb8f);
    std::__cxx11::stringbuf::str();
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogInfoMessage
              ((string *)&create_info_manager,(string *)&extensions_to_skip,&local_438);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_438);
    std::__cxx11::string::~string((string *)&extensions_to_skip);
    std::__cxx11::string::~string((string *)&create_info_manager);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  return XVar11;
code_r0x0010e24f:
  iVar10 = strcmp(LoaderSpecificExtensions::extensions._M_elems[0].extensionName + lVar19 + -0x10,
                  pcVar2);
  lVar19 = lVar19 + 0x98;
  if (iVar10 == 0) goto LAB_0010e2bd;
  goto LAB_0010e246;
}

Assistant:

XrResult LoaderInstance::CreateInstance(PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                                        PFN_xrCreateInstance create_instance_term,
                                        PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                                        std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces,
                                        const XrInstanceCreateInfo* info, std::unique_ptr<LoaderInstance>* loader_instance) {
    LoaderLogger::LogVerboseMessage("xrCreateInstance", "Entering LoaderInstance::CreateInstance");

    // Check the list of enabled extensions to make sure something supports them, and, if we do,
    // add it to the list of enabled extensions
    XrResult last_error = XR_SUCCESS;
    for (uint32_t ext = 0; ext < info->enabledExtensionCount; ++ext) {
        bool found = false;
        // First check the runtime
        if (RuntimeInterface::GetRuntime().SupportsExtension(info->enabledExtensionNames[ext])) {
            found = true;
        }
        // Next check the loader
        if (!found) {
            for (auto& loader_extension : LoaderInstance::LoaderSpecificExtensions()) {
                if (strcmp(loader_extension.extensionName, info->enabledExtensionNames[ext]) == 0) {
                    found = true;
                    break;
                }
            }
        }
        // Finally, check the enabled layers
        if (!found) {
            for (auto& layer_interface : api_layer_interfaces) {
                if (layer_interface->SupportsExtension(info->enabledExtensionNames[ext])) {
                    found = true;
                    break;
                }
            }
        }
        if (!found) {
            std::string msg = "LoaderInstance::CreateInstance, no support found for requested extension: ";
            msg += info->enabledExtensionNames[ext];
            LoaderLogger::LogErrorMessage("xrCreateInstance", msg);
            last_error = XR_ERROR_EXTENSION_NOT_PRESENT;
            break;
        }
    }

    // Topmost means "closest to the application"
    PFN_xrGetInstanceProcAddr topmost_gipa = get_instance_proc_addr_term;
    XrInstance instance{XR_NULL_HANDLE};

    if (XR_SUCCEEDED(last_error)) {
        // Remove the loader-supported-extensions (debug utils), if it's in the list of enabled extensions but not supported by
        // the runtime.
        InstanceCreateInfoManager create_info_manager{info};
        const XrInstanceCreateInfo* modified_create_info = info;
        if (info->enabledExtensionCount > 0) {
            std::vector<const char*> extensions_to_skip;
            for (const auto& ext : LoaderInstance::LoaderSpecificExtensions()) {
                if (!RuntimeInterface::GetRuntime().SupportsExtension(ext.extensionName)) {
                    extensions_to_skip.emplace_back(ext.extensionName);
                }
            }
            modified_create_info = create_info_manager.FilterOutExtensions(extensions_to_skip);
        }

        // Only start the xrCreateApiLayerInstance stack if we have layers.
        if (!api_layer_interfaces.empty()) {
            // Initialize an array of ApiLayerNextInfo structs
            std::unique_ptr<XrApiLayerNextInfo[]> next_info_list(new XrApiLayerNextInfo[api_layer_interfaces.size()]);
            size_t ni_index = api_layer_interfaces.size() - 1;
            for (size_t i = 0; i <= ni_index; i++) {
                next_info_list[i].structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
                next_info_list[i].structVersion = XR_API_LAYER_NEXT_INFO_STRUCT_VERSION;
                next_info_list[i].structSize = sizeof(XrApiLayerNextInfo);
            }

            // Go through all layers, and override the instance pointers with the layer version.  However,
            // go backwards through the layer list so we replace in reverse order so the layers can call their next function
            // appropriately.
            PFN_xrCreateApiLayerInstance topmost_cali_fp = create_api_layer_instance_term;
            XrApiLayerNextInfo* topmost_nextinfo = nullptr;
            for (auto layer_interface = api_layer_interfaces.rbegin(); layer_interface != api_layer_interfaces.rend();
                 ++layer_interface) {
                // Collect current layer's function pointers
                PFN_xrGetInstanceProcAddr cur_gipa_fp = (*layer_interface)->GetInstanceProcAddrFuncPointer();
                PFN_xrCreateApiLayerInstance cur_cali_fp = (*layer_interface)->GetCreateApiLayerInstanceFuncPointer();

                // Fill in layer info and link previous (lower) layer fxn pointers
                strncpy(next_info_list[ni_index].layerName, (*layer_interface)->LayerName().c_str(),
                        XR_MAX_API_LAYER_NAME_SIZE - 1);
                next_info_list[ni_index].layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
                next_info_list[ni_index].next = topmost_nextinfo;
                next_info_list[ni_index].nextGetInstanceProcAddr = topmost_gipa;
                next_info_list[ni_index].nextCreateApiLayerInstance = topmost_cali_fp;

                // Update saved pointers for next iteration
                topmost_nextinfo = &next_info_list[ni_index];
                topmost_gipa = cur_gipa_fp;
                topmost_cali_fp = cur_cali_fp;
                ni_index--;
            }

            // Populate the ApiLayerCreateInfo struct and pass to topmost CreateApiLayerInstance()
            XrApiLayerCreateInfo api_layer_ci = {};
            api_layer_ci.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO;
            api_layer_ci.structVersion = XR_API_LAYER_CREATE_INFO_STRUCT_VERSION;
            api_layer_ci.structSize = sizeof(XrApiLayerCreateInfo);
            api_layer_ci.loaderInstance = nullptr;  // Not used.
            api_layer_ci.settings_file_location[0] = '\0';
            api_layer_ci.nextInfo = next_info_list.get();
            //! @todo do we filter our create info extension list here?
            //! Think that actually each layer might need to filter...
            last_error = topmost_cali_fp(modified_create_info, &api_layer_ci, &instance);

        } else {
            // The loader's terminator is the topmost CreateInstance if there are no layers.
            last_error = create_instance_term(modified_create_info, &instance);
        }

        if (XR_FAILED(last_error)) {
            LoaderLogger::LogErrorMessage("xrCreateInstance", "LoaderInstance::CreateInstance chained CreateInstance call failed");
        }
    }

    if (XR_SUCCEEDED(last_error)) {
        loader_instance->reset(new LoaderInstance(instance, info, topmost_gipa, std::move(api_layer_interfaces)));

        std::ostringstream oss;
        oss << "LoaderInstance::CreateInstance succeeded with ";
        oss << (*loader_instance)->LayerInterfaces().size();
        oss << " layers enabled and runtime interface - created instance = ";
        oss << HandleToHexString((*loader_instance)->GetInstanceHandle());
        LoaderLogger::LogInfoMessage("xrCreateInstance", oss.str());
    }

    return last_error;
}